

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::IsNatural(ON_NurbsSurface *this,int dir,int end)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  size_t sStack_50;
  double parameter_list [2];
  ON_Interval domain;
  
  if (2 < (uint)end || 1 < (uint)dir) {
    return false;
  }
  pdVar2 = parameter_list;
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  parameter_list[0] = ON_DBL_QNAN;
  parameter_list[1] = ON_DBL_QNAN;
  if ((end & 1U) == 0) {
    parameter_list[0] = ON_Interval::operator[](&domain,0);
    if (1 < end - 1U) {
      sStack_50 = 1;
      goto LAB_005585e4;
    }
    pdVar2 = parameter_list + 1;
    sStack_50 = 2;
  }
  else {
    sStack_50 = 1;
  }
  dVar3 = ON_Interval::operator[](&domain,1);
  *pdVar2 = dVar3;
LAB_005585e4:
  bVar1 = IsNatural(this,dir,sStack_50,parameter_list);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::IsNatural(int dir, int end) const
{
  if (dir < 0 || dir > 1 || end < 0 || end > 2)
    return false;

  const ON_Interval domain = Domain(dir);
  size_t parameter_count = 0;
  double parameter_list[2] = {ON_DBL_QNAN,ON_DBL_QNAN};
  if (0 == end || 2 == end)
    parameter_list[parameter_count++] = domain[0];
  if (1 == end || 2 == end)
    parameter_list[parameter_count++] = domain[1];
  return ON_NurbsSurface::IsNatural(dir, parameter_count, parameter_list);
}